

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

IntBounds *
IntBounds::Merge(Value *bounds0Value,IntBounds *bounds0,Value *bounds1Value,IntBounds *bounds1)

{
  int32 lowerBound;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int *piVar4;
  bool local_49;
  IntConstantBounds local_48;
  IntBounds *local_40;
  IntBounds *mergedBounds;
  JitArenaAllocator *allocator;
  IntBounds *bounds1_local;
  Value *bounds1Value_local;
  IntBounds *bounds0_local;
  Value *bounds0Value_local;
  
  allocator = (JitArenaAllocator *)bounds1;
  bounds1_local = (IntBounds *)bounds1Value;
  bounds1Value_local = (Value *)bounds0;
  bounds0_local = (IntBounds *)bounds0Value;
  if (bounds0Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x231,"(bounds0Value)","bounds0Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Verify((IntBounds *)bounds1Value_local);
  if (bounds1_local == (IntBounds *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x233,"(bounds1Value)","bounds1Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Verify((IntBounds *)allocator);
  if ((JitArenaAllocator *)bounds1Value_local == allocator) {
    bounds0Value_local = bounds1Value_local;
  }
  else {
    mergedBounds = (IntBounds *)
                   JsUtil::
                   BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::GetAllocator((BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                   *)(bounds1Value_local + 1));
    piVar4 = min<int>((int *)bounds1Value_local,(int *)allocator);
    lowerBound = *piVar4;
    piVar4 = max<int>((int *)&bounds1Value_local->field_0x4,
                      (int *)((long)&(allocator->super_ArenaAllocator).
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     .super_Allocator.outOfMemoryFunc + 4));
    IntConstantBounds::IntConstantBounds(&local_48,lowerBound,*piVar4);
    bVar2 = WasConstantUpperBoundEstablishedExplicitly((IntBounds *)bounds1Value_local);
    local_49 = false;
    if (bVar2) {
      local_49 = WasConstantUpperBoundEstablishedExplicitly((IntBounds *)allocator);
    }
    local_40 = New(&local_48,local_49,(JitArenaAllocator *)mergedBounds);
    MergeBoundSets<true>
              ((Value *)bounds0_local,(IntBounds *)bounds1Value_local,(Value *)bounds1_local,
               (IntBounds *)allocator,local_40);
    MergeBoundSets<false>
              ((Value *)bounds0_local,(IntBounds *)bounds1Value_local,(Value *)bounds1_local,
               (IntBounds *)allocator,local_40);
    bVar2 = HasBounds(local_40);
    if (bVar2) {
      Verify(local_40);
      bounds0Value_local = (Value *)local_40;
    }
    else {
      Delete(local_40);
      bounds0Value_local = (Value *)0x0;
    }
  }
  return (IntBounds *)bounds0Value_local;
}

Assistant:

const IntBounds *IntBounds::Merge(
    const Value *const bounds0Value,
    const IntBounds *const bounds0,
    const Value *const bounds1Value,
    const IntBounds *const bounds1)
{
    Assert(bounds0Value);
    bounds0->Verify();
    Assert(bounds1Value);
    bounds1->Verify();

    if(bounds0 == bounds1)
        return bounds0;

    JitArenaAllocator *const allocator = bounds0->relativeLowerBounds.GetAllocator();
    IntBounds *const mergedBounds =
        New(IntConstantBounds(
                min(bounds0->constantLowerBound, bounds1->constantLowerBound),
                max(bounds0->constantUpperBound, bounds1->constantUpperBound)),
            bounds0->WasConstantUpperBoundEstablishedExplicitly() && bounds1->WasConstantUpperBoundEstablishedExplicitly(),
            allocator);
    MergeBoundSets<true>(bounds0Value, bounds0, bounds1Value, bounds1, mergedBounds);
    MergeBoundSets<false>(bounds0Value, bounds0, bounds1Value, bounds1, mergedBounds);
    if(mergedBounds->HasBounds())
    {
        mergedBounds->Verify();
        return mergedBounds;
    }
    mergedBounds->Delete();
    return nullptr;
}